

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void()>::callback<std::function<void()>>
          (callback<void()> *this,function<void_()> *func)

{
  callable_impl<void,_std::function<void_()>_> *this_00;
  function<void_()> local_40;
  
  this_00 = (callable_impl<void,_std::function<void_()>_> *)operator_new(0x30);
  std::function<void_()>::function(&local_40,func);
  callback<void_()>::callable_impl<void,_std::function<void_()>_>::callable_impl(this_00,&local_40);
  *(callable_impl<void,_std::function<void_()>_> **)this = this_00;
  booster::atomic_counter::inc();
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}